

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O2

void __thiscall adios2::core::VariableBase::SetShape(VariableBase *this,Dims *shape)

{
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (this->m_Type == String) {
    std::__cxx11::string::string((string *)&local_30,"Core",&local_b1);
    std::__cxx11::string::string((string *)&local_50,"VariableBase",&local_b2);
    std::__cxx11::string::string((string *)&local_70,"SetShape",&local_b3);
    std::operator+(&local_b0,"string variable ",&this->m_Name);
    std::operator+(&local_90,&local_b0,
                   " is always LocalValue, can\'t change shape, in call to SetShape");
    helper::Throw<std::invalid_argument>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if (this->m_SingleValue == true) {
    std::__cxx11::string::string((string *)&local_30,"Core",&local_b1);
    std::__cxx11::string::string((string *)&local_50,"VariableBase",&local_b2);
    std::__cxx11::string::string((string *)&local_70,"SetShape",&local_b3);
    std::operator+(&local_b0,"selection is not valid for single value variable ",&this->m_Name);
    std::operator+(&local_90,&local_b0,", in call to SetShape");
    helper::Throw<std::invalid_argument>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if (this->m_ConstantDims == true) {
    std::__cxx11::string::string((string *)&local_30,"Core",&local_b1);
    std::__cxx11::string::string((string *)&local_50,"VariableBase",&local_b2);
    std::__cxx11::string::string((string *)&local_70,"SetShape",&local_b3);
    std::operator+(&local_b0,"selection is not valid for constant shape variable ",&this->m_Name);
    std::operator+(&local_90,&local_b0,", in call to SetShape");
    helper::Throw<std::invalid_argument>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if (this->m_ShapeID == LocalArray) {
    std::__cxx11::string::string((string *)&local_30,"Core",&local_b1);
    std::__cxx11::string::string((string *)&local_50,"VariableBase",&local_b2);
    std::__cxx11::string::string((string *)&local_70,"SetShape",&local_b3);
    std::operator+(&local_b0,"can\'t assign shape dimensions to local array variable ",&this->m_Name
                  );
    std::operator+(&local_90,&local_b0,", in call to SetShape");
    helper::Throw<std::invalid_argument>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((long)(this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->m_Shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start !=
      (long)(shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)&local_30,"Core",&local_b1);
    std::__cxx11::string::string((string *)&local_50,"VariableBase",&local_b2);
    std::__cxx11::string::string((string *)&local_70,"SetShape",&local_b3);
    std::operator+(&local_b0,"can\'t assign change dimension count on variable ",&this->m_Name);
    std::operator+(&local_90,&local_b0,", in call to SetShape");
    helper::Throw<std::invalid_argument>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->m_Shape,shape);
  return;
}

Assistant:

void VariableBase::SetShape(const adios2::Dims &shape)
{
    if (m_Type == helper::GetDataType<std::string>())
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "string variable " + m_Name +
                                                 " is always LocalValue, can't change "
                                                 "shape, in call to SetShape");
    }

    if (m_SingleValue)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "selection is not valid for single value variable " +
                                                 m_Name + ", in call to SetShape");
    }

    if (m_ConstantDims)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "selection is not valid for constant shape variable " +
                                                 m_Name + ", in call to SetShape");
    }

    if (m_ShapeID == ShapeID::LocalArray)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "can't assign shape dimensions "
                                             "to local array variable " +
                                                 m_Name + ", in call to SetShape");
    }

    if (m_Shape.size() != shape.size())
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "can't assign change dimension count on variable " +
                                                 m_Name + ", in call to SetShape");
    }
    m_Shape = shape;
#if defined(ADIOS2_HAVE_KOKKOS) || defined(ADIOS2_HAVE_GPU_SUPPORT)
    UpdateLayout(m_Shape);
#endif
}